

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O1

string * __thiscall
playableWorld::turn_left_abi_cxx11_(string *__return_storage_ptr__,playableWorld *this)

{
  pointer pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"left","");
  std::__cxx11::string::_M_assign((string *)&this->agent_direction);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->agent_direction)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->agent_direction)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string playableWorld::turn_left()
{
  
    set_agent_direction("left");
  
  return get_agent_direction();
}